

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteVarBounds
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this)

{
  File *f;
  FeederType *pFVar1;
  ExampleModel *pEVar2;
  
  f = &this->nm;
  BinaryFormatter::apr(&this->super_FormatterType,f,"b\t#%d bounds (on variables)\n");
  pFVar1 = this->feeder_;
  pEVar2 = pFVar1->mdl_;
  WriteBndRangeOrCompl(this,f,pEVar2->var_lb[0],pEVar2->var_ub[0],0,0);
  pEVar2 = pFVar1->mdl_;
  WriteBndRangeOrCompl(this,f,pEVar2->var_lb[1],pEVar2->var_ub[1],0,0);
  return;
}

Assistant:

void NLWriter2<Params>::WriteVarBounds() {
	apr(nm, "b\t#%d bounds (on variables)\n",
      (int)Hdr().num_vars);
  VarBndWriter vbw(*this);
  Feeder().FeedVarBounds(vbw);
  assert((int)Hdr().num_vars == vbw.GetNWritten());
}